

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.cpp
# Opt level: O1

void __thiscall
helics::PublicationInfo::removeSubscriber(PublicationInfo *this,GlobalHandle subscriberToRemove)

{
  pointer pSVar1;
  pointer pSVar2;
  pointer pSVar3;
  long lVar4;
  GlobalFederateId GVar5;
  InterfaceHandle IVar6;
  iterator __first;
  
  pSVar1 = (this->subscribers).
           super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->subscribers).
           super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = ((long)pSVar2 - (long)pSVar1 >> 3) * -0x3333333333333333 >> 2;
  GVar5 = subscriberToRemove.fed_id.gid;
  IVar6 = subscriberToRemove.handle.hid;
  pSVar3 = pSVar1;
  if (0 < lVar4) {
    pSVar3 = pSVar1 + lVar4 * 4;
    lVar4 = lVar4 + 1;
    __first._M_current = pSVar1 + 2;
    do {
      if ((__first._M_current[-2].id.fed_id.gid == GVar5.gid) &&
         (__first._M_current[-2].id.handle.hid == IVar6.hid)) {
        __first._M_current = __first._M_current + -2;
        goto LAB_002d2ea4;
      }
      if ((__first._M_current[-1].id.fed_id.gid == GVar5.gid) &&
         (__first._M_current[-1].id.handle.hid == IVar6.hid)) {
        __first._M_current = __first._M_current + -1;
        goto LAB_002d2ea4;
      }
      if ((((__first._M_current)->id).fed_id.gid == GVar5.gid) &&
         (((__first._M_current)->id).handle.hid == IVar6.hid)) goto LAB_002d2ea4;
      if ((__first._M_current[1].id.fed_id.gid == GVar5.gid) &&
         (__first._M_current[1].id.handle.hid == IVar6.hid)) {
        __first._M_current = __first._M_current + 1;
        goto LAB_002d2ea4;
      }
      lVar4 = lVar4 + -1;
      __first._M_current = __first._M_current + 4;
    } while (1 < lVar4);
  }
  lVar4 = ((long)pSVar2 - (long)pSVar3 >> 3) * -0x3333333333333333;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      __first._M_current = pSVar2;
      if ((lVar4 != 3) ||
         (((pSVar3->id).fed_id.gid == GVar5.gid &&
          (__first._M_current = pSVar3, (pSVar3->id).handle.hid == IVar6.hid)))) goto LAB_002d2ea4;
      pSVar3 = pSVar3 + 1;
    }
    if (((pSVar3->id).fed_id.gid == GVar5.gid) &&
       (__first._M_current = pSVar3, (pSVar3->id).handle.hid == IVar6.hid)) goto LAB_002d2ea4;
    pSVar3 = pSVar3 + 1;
  }
  __first._M_current = pSVar3;
  if (IVar6.hid != (pSVar3->id).handle.hid || (pSVar3->id).fed_id.gid != GVar5.gid) {
    __first._M_current = pSVar2;
  }
LAB_002d2ea4:
  pSVar1 = __first._M_current;
  if (__first._M_current != pSVar2) {
    while (pSVar1 = pSVar1 + 1, pSVar1 != pSVar2) {
      if (((pSVar1->id).fed_id.gid != GVar5.gid) || ((pSVar1->id).handle.hid != IVar6.hid)) {
        (__first._M_current)->id = pSVar1->id;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &(__first._M_current)->key,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pSVar1->key)
        ;
        __first._M_current = __first._M_current + 1;
      }
    }
  }
  std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::
  _M_erase(&this->subscribers,__first,
           (this->subscribers).
           super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void PublicationInfo::removeSubscriber(GlobalHandle subscriberToRemove)
{
    subscribers.erase(std::remove_if(subscribers.begin(),
                                     subscribers.end(),
                                     [subscriberToRemove](const auto& val) {
                                         return val.id == subscriberToRemove;
                                     }),
                      subscribers.end());
}